

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O0

string * __thiscall
ast::Conditional_expression::get_symbol_abi_cxx11_
          (string *__return_storage_ptr__,Conditional_expression *this)

{
  uint16_t uVar1;
  Value_type VVar2;
  Conditional_expression *this_local;
  
  VVar2 = Expression::get_type(&this->super_Expression);
  if ((VVar2 == LABEL) && (uVar1 = Expression::get_value(this->logical_expression), uVar1 != 0)) {
    (*this->true_expression->_vptr_Expression[4])(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  (*this->false_expression->_vptr_Expression[4])(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string get_symbol() {	//	get_type() só pode ser invocado depois de evaluate().
		return get_type() == LABEL && logical_expression->get_value()
					? true_expression->get_symbol()
					: false_expression->get_symbol();
	}